

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O3

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<Gecko::NodeRef*,std::vector<Gecko::NodeRef,std::allocator<Gecko::NodeRef>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,float *__a,float *__b,float *__c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  
  fVar1 = *__a;
  fVar2 = *__b;
  fVar3 = *__c;
  if (fVar2 <= fVar1) {
    if (fVar1 < fVar3) {
      uVar4 = *__result;
      goto LAB_00107591;
    }
    uVar4 = *__result;
    if (fVar2 < fVar3) goto LAB_001075a3;
  }
  else {
    if (fVar3 <= fVar2) {
      uVar4 = *__result;
      if (fVar1 < fVar3) {
LAB_001075a3:
        *__result = *(undefined8 *)__c;
        *(undefined8 *)__c = uVar4;
        return;
      }
LAB_00107591:
      *__result = *(undefined8 *)__a;
      *(undefined8 *)__a = uVar4;
      return;
    }
    uVar4 = *__result;
  }
  *__result = *(undefined8 *)__b;
  *(undefined8 *)__b = uVar4;
  return;
}

Assistant:

bool operator<(const NodeRef& node) const { return pos < node.pos; }